

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O2

size_t ZSTD_compressBlock_opt2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 ZSTD_dictMode_e dictMode)

{
  byte bVar1;
  ZSTD_optimal_t *pZVar2;
  rawSeqStore_t *prVar3;
  BYTE *pBVar4;
  seqDef *psVar5;
  undefined8 uVar6;
  ZSTD_optimal_t *pZVar7;
  optState_t *optPtr;
  U32 UVar8;
  uint uVar9;
  U32 UVar10;
  U32 UVar11;
  U32 UVar12;
  uint uVar13;
  U32 UVar14;
  long lVar15;
  ZSTD_optimal_t *pZVar16;
  ulong uVar17;
  int *piVar18;
  ulong uVar19;
  int iVar20;
  U32 *pUVar21;
  BYTE *pBVar22;
  BYTE *pBVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  U32 UVar27;
  int iVar28;
  ZSTD_match_t *pZVar29;
  bool bVar30;
  repcodes_t rVar31;
  U32 nbMatches;
  ZSTD_match_t *local_128;
  BYTE *local_120;
  optState_t *local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  BYTE *local_f8;
  int local_ec;
  uint local_e8;
  U32 nextToUpdate3;
  U32 (*local_e0) [3];
  BYTE *local_d8;
  ulong local_d0;
  BYTE *local_c8;
  U32 *local_c0;
  undefined8 local_b8;
  U32 local_b0;
  void *local_a8;
  seqStore_t *local_a0;
  code *local_98;
  BYTE *local_90;
  BYTE *local_88;
  ZSTD_optimal_t *local_80;
  BYTE *local_78;
  int *local_70;
  ZSTD_optLdm_t local_68;
  
  uVar13 = (ms->cParams).minMatch;
  uVar9 = 3;
  if (uVar13 < 6) {
    uVar9 = uVar13 - 3;
  }
  uVar19 = 0;
  if (2 < uVar13) {
    uVar19 = (ulong)uVar9;
  }
  uVar9 = (ms->window).dictLimit;
  pBVar23 = (ms->window).base;
  uVar24 = (ms->cParams).targetLength;
  local_e8 = 0xfff;
  if (uVar24 < 0xfff) {
    local_e8 = uVar24;
  }
  local_118 = &ms->opt;
  nextToUpdate3 = ms->nextToUpdate;
  pZVar29 = (ms->opt).matchTable;
  pZVar2 = (ms->opt).priceTable;
  local_b8 = 0;
  local_f8 = (BYTE *)((long)src + srcSize);
  local_b0 = 0;
  local_98 = (code *)(&PTR_ZSTD_btGetAllMatches_noDict_3_0029ab70)[(ulong)dictMode * 4 + uVar19];
  local_d0 = (ulong)((uVar13 - 3 != 0) + 3);
  prVar3 = ms->ldmSeqStore;
  if (prVar3 == (rawSeqStore_t *)0x0) {
    local_68.seqStore.posInSequence = 0;
    local_68.seqStore.size = 0;
    local_68.seqStore.seq = (rawSeq *)0x0;
    local_68.seqStore.pos = 0;
    local_68.seqStore.capacity = 0;
  }
  else {
    local_68.seqStore.capacity = prVar3->capacity;
    local_68.seqStore.seq = prVar3->seq;
    local_68.seqStore.pos = prVar3->pos;
    local_68.seqStore.posInSequence = prVar3->posInSequence;
    local_68.seqStore.size = prVar3->size;
  }
  local_68.offset = 0;
  local_90 = (BYTE *)((long)src + (srcSize - 8));
  local_68.startPosInBlock = 0;
  local_68.endPosInBlock = 0;
  local_e0 = (U32 (*) [3])rep;
  local_a0 = seqStore;
  ZSTD_opt_getNextMatchAndUpdateSeqStore(&local_68,0,(U32)srcSize);
  ZSTD_rescaleFreqs(local_118,(BYTE *)src,srcSize,2);
  pBVar23 = (BYTE *)((ulong)(pBVar23 + uVar9 == (BYTE *)src) + (long)src);
  local_78 = local_f8 + -0x20;
  local_88 = (BYTE *)(local_d0 & 0xffffffff);
  local_80 = pZVar2 + 1;
  local_ec = 0;
  local_128 = pZVar29;
  local_d8 = (BYTE *)src;
  do {
    while( true ) {
      pBVar22 = local_f8;
      if (local_90 <= pBVar23) {
        return (long)local_f8 - (long)local_d8;
      }
      UVar27 = (int)pBVar23 - (int)local_d8;
      local_c8 = pBVar23;
      nbMatches = (*local_98)(pZVar29,ms,&nextToUpdate3,pBVar23,local_f8,local_e0,UVar27 == 0,
                              local_d0);
      pBVar23 = local_c8;
      ZSTD_optLdm_processMatchCandidate
                (&local_68,pZVar29,&nbMatches,(int)local_c8 - (int)src,(int)pBVar22 - (int)local_c8)
      ;
      if ((ulong)nbMatches != 0) break;
      pBVar23 = pBVar23 + 1;
    }
    for (lVar15 = 4; lVar15 != 7; lVar15 = lVar15 + 1) {
      pZVar2->rep[lVar15 + -4] = local_e0[-2][lVar15 + 2];
    }
    pZVar2->mlen = 0;
    pZVar2->litlen = UVar27;
    local_108 = (ulong)nbMatches;
    UVar8 = ZSTD_litLengthPrice(UVar27,local_118,2);
    pZVar2->price = UVar8;
    uVar9 = (int)local_108 - 1;
    uVar13 = pZVar29[uVar9].len;
    local_a8 = src;
    if (local_e8 < uVar13) {
      UVar8 = pZVar29[uVar9].off;
      uVar9 = 0;
    }
    else {
      if ((int)UVar8 < 0) {
        __assert_fail("opt[0].price >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,0x477,
                      "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                     );
      }
      UVar10 = ZSTD_litLengthPrice(0,local_118,2);
      pZVar16 = local_80;
      for (pBVar23 = (BYTE *)0x1; pBVar23 < local_88; pBVar23 = pBVar23 + 1) {
        pZVar16->price = 0x40000000;
        pZVar16 = pZVar16 + 1;
      }
      local_120 = (BYTE *)CONCAT44(local_120._4_4_,UVar10 + UVar8);
      uVar19 = 0;
      local_110 = (ulong)UVar27;
      while (uVar19 != local_108) {
        UVar27 = local_128[uVar19].off;
        uVar13 = local_128[uVar19].len;
        local_100 = uVar19;
        while (uVar9 = (uint)pBVar23, uVar9 <= uVar13) {
          uVar24 = ZSTD_highbit32(UVar27);
          if (uVar9 < 3) {
LAB_001ea518:
            __assert_fail("matchLength >= MINMATCH",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                          ,0x148,
                          "U32 ZSTD_getMatchPrice(const U32, const U32, const optState_t *const, const int)"
                         );
          }
          if ((ms->opt).priceType == zop_predef) {
            UVar8 = ZSTD_fracWeight(uVar9 - 3);
            iVar28 = UVar8 + uVar24 * 0x100 + 0x1000;
          }
          else {
            UVar8 = (ms->opt).offCodeSumBasePrice;
            UVar11 = ZSTD_fracWeight((ms->opt).offCodeFreq[uVar24]);
            UVar12 = ZSTD_MLcode(uVar9 - 3);
            bVar1 = ""[UVar12];
            UVar10 = (ms->opt).matchLengthSumBasePrice;
            UVar12 = ZSTD_fracWeight((ms->opt).matchLengthFreq[UVar12]);
            iVar28 = (((bVar1 + uVar24) * 0x100 + (UVar8 - UVar11) + UVar10) - UVar12) + 0x33;
          }
          uVar19 = (ulong)pBVar23 & 0xffffffff;
          pZVar2[uVar19].mlen = uVar9;
          pZVar2[uVar19].off = UVar27;
          pZVar2[uVar19].litlen = (U32)local_110;
          pZVar2[uVar19].price = iVar28 + (int)local_120;
          pBVar23 = (BYTE *)(ulong)(uVar9 + 1);
        }
        uVar19 = local_100 + 1;
      }
      uVar25 = (ulong)((int)pBVar23 - 1);
      uVar19 = 1;
      while( true ) {
        optPtr = local_118;
        uVar17 = uVar25 & 0xffffffff;
        if (uVar17 < uVar19) break;
        local_110 = uVar17;
        if (uVar19 == 0x1000) {
          __assert_fail("cur < ZSTD_OPT_NUM",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                        ,0x492,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        pZVar16 = pZVar2 + uVar19;
        UVar27 = 1;
        if (pZVar2[uVar19 - 1].mlen == 0) {
          UVar27 = pZVar16[-1].litlen + 1;
        }
        local_120 = local_c8 + uVar19;
        local_108 = CONCAT44(local_108._4_4_,pZVar16[-1].price);
        local_100 = uVar19;
        UVar8 = ZSTD_rawLiteralsCost
                          (local_120 + -1,(U32)local_118,(optState_t *)0x2,pZVar16[-1].price);
        UVar10 = ZSTD_litLengthPrice(UVar27,optPtr,2);
        iVar28 = UVar10 + UVar8 + (int)local_108;
        UVar8 = ZSTD_litLengthPrice(UVar27 - 1,optPtr,2);
        uVar26 = local_100;
        pZVar29 = local_128;
        iVar28 = iVar28 - UVar8;
        if (999999999 < iVar28) {
          __assert_fail("price < 1000000000",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                        ,0x49b,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        iVar20 = (int)local_100;
        if (pZVar2[uVar19].price < iVar28) {
          uVar13 = pZVar16->mlen;
          if (local_100 < uVar13) {
            __assert_fail("cur >= opt[cur].mlen",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                          ,0x4b1,
                          "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                         );
          }
          if (uVar13 == 0) goto LAB_001e9eca;
          rVar31 = ZSTD_newRep(pZVar2[iVar20 - uVar13].rep,pZVar16->off,(uint)(pZVar16->litlen == 0)
                              );
          *&pZVar16->rep = rVar31.rep;
        }
        else {
          pZVar16->off = 0;
          pZVar16->mlen = 0;
          pZVar16->litlen = UVar27;
          pZVar16->price = iVar28;
LAB_001e9eca:
          pZVar16->rep[2] = pZVar16[-1].rep[2];
          *(undefined8 *)pZVar16->rep = *(undefined8 *)pZVar16[-1].rep;
        }
        if (local_120 <= local_90) {
          uVar17 = local_110;
          if (uVar26 == local_110) break;
          iVar28 = pZVar16->price;
          if (iVar28 < 0) {
            __assert_fail("opt[cur].price >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                          ,0x4c5,
                          "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                         );
          }
          local_110 = 0;
          bVar30 = pZVar16->mlen != 0;
          if (!bVar30) {
            local_110 = (ulong)pZVar16->litlen;
          }
          local_c0 = &pZVar16->mlen;
          UVar27 = ZSTD_litLengthPrice(0,local_118,2);
          pBVar22 = local_f8;
          pBVar23 = local_120;
          local_108 = CONCAT44(local_108._4_4_,UVar27);
          nbMatches = (*local_98)(pZVar29,ms,&nextToUpdate3,local_120,local_f8,pZVar16->rep,bVar30,
                                  local_d0);
          pZVar29 = local_128;
          ZSTD_optLdm_processMatchCandidate
                    (&local_68,local_128,&nbMatches,(int)pBVar23 - (int)local_a8,
                     (int)pBVar22 - (int)pBVar23);
          piVar18 = (int *)(ulong)nbMatches;
          if (piVar18 != (int *)0x0) {
            uVar13 = pZVar29[nbMatches - 1].len;
            local_70 = piVar18;
            if ((local_e8 < uVar13) || (0xfff < uVar13 + iVar20)) {
              UVar27 = 0;
              if (*local_c0 == 0) {
                UVar27 = pZVar16->litlen;
              }
              UVar8 = local_128[nbMatches - 1].off;
              uVar9 = iVar20 - UVar27;
              if (0x1000 < iVar20 - UVar27) {
                uVar9 = 0;
              }
              UVar27 = (U32)local_110;
              goto LAB_001ea1f8;
            }
            local_108 = CONCAT44(local_108._4_4_,(int)local_108 + iVar28);
            pUVar21 = (U32 *)0x0;
            while (uVar26 = local_100, pUVar21 != (U32 *)local_70) {
              local_120 = local_88;
              if (pUVar21 != (U32 *)0x0) {
                local_120 = (BYTE *)(ulong)(local_128[(long)((long)pUVar21 + -1)].len + 1);
              }
              UVar27 = local_128[(long)pUVar21].off;
              local_c0 = pUVar21;
              for (pBVar23 = (BYTE *)(ulong)local_128[(long)pUVar21].len; local_120 <= pBVar23;
                  pBVar23 = pBVar23 + -1) {
                uVar13 = ZSTD_highbit32(UVar27);
                if (pBVar23 < (BYTE *)0x3) goto LAB_001ea518;
                UVar8 = (U32)pBVar23;
                if ((ms->opt).priceType == zop_predef) {
                  UVar10 = ZSTD_fracWeight(UVar8 - 3);
                  iVar28 = UVar10 + uVar13 * 0x100 + 0x1000;
                }
                else {
                  UVar10 = (ms->opt).offCodeSumBasePrice;
                  UVar12 = ZSTD_fracWeight((ms->opt).offCodeFreq[uVar13]);
                  UVar14 = ZSTD_MLcode(UVar8 - 3);
                  bVar1 = ""[UVar14];
                  UVar11 = (ms->opt).matchLengthSumBasePrice;
                  UVar14 = ZSTD_fracWeight((ms->opt).matchLengthFreq[UVar14]);
                  iVar28 = (((bVar1 + uVar13) * 0x100 + (UVar10 - UVar12) + UVar11) - UVar14) + 0x33
                  ;
                }
                uVar13 = UVar8 + (int)local_100;
                uVar19 = (ulong)uVar13;
                if (((uint)uVar25 < uVar13) || (iVar28 + (int)local_108 < pZVar2[uVar19].price)) {
                  uVar25 = uVar25 & 0xffffffff;
                  pZVar16 = local_80 + uVar25;
                  for (; uVar25 < uVar19; uVar25 = uVar25 + 1) {
                    pZVar16->price = 0x40000000;
                    pZVar16 = pZVar16 + 1;
                  }
                  pZVar2[uVar19].mlen = UVar8;
                  pZVar2[uVar19].off = UVar27;
                  pZVar2[uVar19].litlen = (U32)local_110;
                  pZVar2[uVar19].price = iVar28 + (int)local_108;
                }
              }
              pUVar21 = (U32 *)((long)local_c0 + 1);
            }
          }
        }
        uVar19 = uVar26 + 1;
      }
      local_ec = pZVar2[uVar17].price;
      UVar8 = pZVar2[uVar17].off;
      uVar13 = pZVar2[uVar17].mlen;
      UVar27 = pZVar2[uVar17].litlen;
      local_b0 = pZVar2[uVar17].rep[2];
      local_b8 = *(undefined8 *)pZVar2[uVar17].rep;
      uVar9 = (uint)uVar25 - (UVar27 + uVar13);
      if ((uint)uVar25 < UVar27 + uVar13 || uVar9 == 0) {
        uVar9 = 0;
      }
      else if (0xfff < uVar9) {
        __assert_fail("cur < ZSTD_OPT_NUM",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,0x504,
                      "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                     );
      }
    }
LAB_001ea1f8:
    if (pZVar2->mlen != 0) {
      __assert_fail("opt[0].mlen == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x507,
                    "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                   );
    }
    if (uVar13 == 0) {
      (*local_e0)[2] = pZVar2[uVar9].rep[2];
      *(undefined8 *)*local_e0 = *(undefined8 *)pZVar2[uVar9].rep;
    }
    else {
      rVar31 = ZSTD_newRep(pZVar2[uVar9].rep,UVar8,(uint)(UVar27 == 0));
      *local_e0 = rVar31.rep;
    }
    if (0xfff < uVar9 + 1) {
      __assert_fail("storeEnd < ZSTD_OPT_NUM",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x51a,
                    "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                   );
    }
    uVar25 = (ulong)(uVar9 + 1);
    pZVar2[uVar25].price = local_ec;
    pZVar2[uVar25].off = UVar8;
    pZVar2[uVar25].mlen = uVar13;
    pZVar2[uVar25].litlen = UVar27;
    *(undefined8 *)pZVar2[uVar25].rep = local_b8;
    pZVar2[uVar25].rep[2] = local_b0;
    uVar19 = (ulong)uVar9;
    while (uVar13 = (uint)uVar19, uVar13 != 0) {
      uVar24 = pZVar2[uVar19].litlen + pZVar2[uVar19].mlen;
      pZVar16 = pZVar2 + uVar19;
      iVar28 = pZVar16->price;
      UVar8 = pZVar16->off;
      UVar10 = pZVar16->mlen;
      UVar11 = pZVar16->litlen;
      pZVar16 = pZVar2 + uVar19;
      UVar27 = pZVar16->rep[0];
      uVar6 = *(undefined8 *)(&pZVar16->litlen + 2);
      pZVar7 = pZVar2 + uVar9;
      pZVar7->litlen = pZVar16->litlen;
      pZVar7->rep[0] = UVar27;
      *(undefined8 *)(&pZVar7->litlen + 2) = uVar6;
      pZVar16 = pZVar2 + uVar9;
      pZVar16->price = iVar28;
      pZVar16->off = UVar8;
      pZVar16->mlen = UVar10;
      pZVar16->litlen = UVar11;
      uVar19 = (ulong)(uVar13 - uVar24);
      if (uVar13 < uVar24) {
        uVar19 = 0;
      }
      uVar9 = uVar9 - 1;
    }
    pBVar22 = local_d8;
    pBVar23 = local_c8;
    for (uVar19 = (ulong)(uVar9 + 1); pZVar29 = local_128, uVar19 <= uVar25; uVar19 = uVar19 + 1) {
      uVar13 = pZVar2[uVar19].litlen;
      uVar17 = (ulong)uVar13;
      uVar9 = pZVar2[uVar19].mlen;
      if ((ulong)uVar9 == 0) {
        if (uVar19 != uVar25) {
          __assert_fail("storePos == storeEnd",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                        ,0x533,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        pBVar23 = pBVar22 + uVar17;
      }
      else {
        pBVar23 = pBVar22 + uVar17;
        if (local_f8 < pBVar23) {
          __assert_fail("anchor + llen <= iend",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                        ,0x538,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        UVar27 = pZVar2[uVar19].off;
        ZSTD_updateStats(local_118,uVar13,pBVar22,UVar27,uVar9);
        if (local_a0->maxNbSeq <=
            (ulong)((long)local_a0->sequences - (long)local_a0->sequencesStart >> 3)) {
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_a0->maxNbLit) {
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        pBVar4 = local_a0->lit;
        if (local_a0->litStart + local_a0->maxNbLit < pBVar4 + uVar17) {
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_78 < pBVar23) {
          ZSTD_safecopyLiterals(pBVar4,pBVar22,pBVar23,local_78);
LAB_001ea3a1:
          local_a0->lit = local_a0->lit + uVar17;
          if (0xffff < uVar13) {
            if (local_a0->longLengthType != ZSTD_llt_none) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x2b2,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            local_a0->longLengthType = ZSTD_llt_literalLength;
            local_a0->longLengthPos =
                 (U32)((ulong)((long)local_a0->sequences - (long)local_a0->sequencesStart) >> 3);
          }
        }
        else {
          uVar6 = *(undefined8 *)(pBVar22 + 8);
          *(undefined8 *)pBVar4 = *(undefined8 *)pBVar22;
          *(undefined8 *)(pBVar4 + 8) = uVar6;
          if (0x10 < uVar13) {
            pBVar23 = local_a0->lit;
            if ((BYTE *)0xffffffffffffffe0 < pBVar23 + 0x10 + (-0x10 - (long)(pBVar22 + 0x10))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                            ,0xe9,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar6 = *(undefined8 *)(pBVar22 + 0x18);
            *(undefined8 *)(pBVar23 + 0x10) = *(undefined8 *)(pBVar22 + 0x10);
            *(undefined8 *)(pBVar23 + 0x18) = uVar6;
            if (0x10 < uVar17 - 0x10) {
              lVar15 = 0;
              do {
                uVar6 = *(undefined8 *)(pBVar22 + lVar15 + 0x20 + 8);
                pBVar4 = pBVar23 + lVar15 + 0x20;
                *(undefined8 *)pBVar4 = *(undefined8 *)(pBVar22 + lVar15 + 0x20);
                *(undefined8 *)(pBVar4 + 8) = uVar6;
                uVar6 = *(undefined8 *)(pBVar22 + lVar15 + 0x30 + 8);
                *(undefined8 *)(pBVar4 + 0x10) = *(undefined8 *)(pBVar22 + lVar15 + 0x30);
                *(undefined8 *)(pBVar4 + 0x18) = uVar6;
                lVar15 = lVar15 + 0x20;
              } while (pBVar4 + 0x20 < pBVar23 + uVar17);
              goto LAB_001ea3a1;
            }
          }
          local_a0->lit = local_a0->lit + uVar17;
        }
        psVar5 = local_a0->sequences;
        psVar5->litLength = (U16)uVar13;
        psVar5->offBase = UVar27;
        if (uVar9 < 3) {
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,700,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar17 = (ulong)uVar9 - 3;
        if (0xffff < uVar17) {
          if (local_a0->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2bf,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_a0->longLengthType = ZSTD_llt_matchLength;
          local_a0->longLengthPos =
               (U32)((ulong)((long)psVar5 - (long)local_a0->sequencesStart) >> 3);
        }
        psVar5->mlBase = (U16)uVar17;
        local_a0->sequences = psVar5 + 1;
        pBVar22 = pBVar22 + (uVar9 + uVar13);
        pBVar23 = pBVar22;
      }
    }
    ZSTD_setBasePrices(local_118,2);
    local_d8 = pBVar22;
    src = local_a8;
  } while( true );
}

Assistant:

static size_t ZSTD_compressBlock_opt2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        const void* src, size_t srcSize, const ZSTD_dictMode_e dictMode)
{
    return ZSTD_compressBlock_opt_generic(ms, seqStore, rep, src, srcSize, 2 /* optLevel */, dictMode);
}